

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O1

ON__UINT32 __thiscall
ON_OutlineFigure::Internal_FigureEndDex(ON_OutlineFigure *this,bool bLogErrors)

{
  bool bVar1;
  ON__UINT32 OVar2;
  uint uVar3;
  
  uVar3 = (this->m_points).m_count;
  if ((uVar3 < 2) ||
     (bVar1 = ON_OutlineFigurePoint::IsBeginFigurePoint((this->m_points).m_a), !bVar1)) {
    if (!bLogErrors) {
      return 0;
    }
  }
  else {
    uVar3 = uVar3 - 1;
    bVar1 = ON_OutlineFigurePoint::IsEndFigurePoint((this->m_points).m_a + uVar3);
    OVar2 = 0;
    if (bVar1) {
      OVar2 = uVar3;
    }
    if (!bLogErrors || bVar1) {
      return OVar2;
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
             ,0x691,"","Figure is missing start or end point.");
  return 0;
}

Assistant:

ON__UINT32 ON_OutlineFigure::Internal_FigureEndDex(
  bool bLogErrors
  ) const
{
  const ON__UINT32 count = m_points.UnsignedCount();
  if (
    count >= 2
    && m_points[0].IsBeginFigurePoint()
    && m_points[count - 1].IsEndFigurePoint()
    )
  {
    return (count - 1);
  }

  if (bLogErrors)
  {
    ON_ERROR("Figure is missing start or end point.");    
  }
  return 0;
}